

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScene::setSceneRect(QGraphicsScene *this,QRectF *rect)

{
  long lVar1;
  uint uVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  bool bVar6;
  long in_FS_OFFSET;
  void *local_38;
  QRectF *pQStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  bVar6 = comparesEqual(rect,(QRectF *)(lVar1 + 0x98));
  if (!bVar6) {
    uVar2 = (uint)(rect->w != 0.0 || rect->h != 0.0);
    *(uint *)(lVar1 + 0xb8) = (*(uint *)(lVar1 + 0xb8) & 0xfffffffe) + uVar2;
    qVar3 = rect->xp;
    qVar4 = rect->yp;
    qVar5 = rect->h;
    *(qreal *)(lVar1 + 0xa8) = rect->w;
    *(qreal *)(lVar1 + 0xb0) = qVar5;
    ((QRectF *)(lVar1 + 0x98))->xp = qVar3;
    *(qreal *)(lVar1 + 0xa0) = qVar4;
    pQStack_30 = (QRectF *)(lVar1 + 200);
    if ((-uVar2 & 1) != 0) {
      pQStack_30 = rect;
    }
    local_38 = (void *)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::setSceneRect(const QRectF &rect)
{
    Q_D(QGraphicsScene);
    if (rect != d->sceneRect) {
        d->hasSceneRect = !rect.isNull();
        d->sceneRect = rect;
        emit sceneRectChanged(d->hasSceneRect ? rect : d->growingItemsBoundingRect);
    }
}